

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::InitSRBResourceCache
          (PipelineResourceSignatureVkImpl *this,ShaderResourceCacheVk *ResourceCache)

{
  Uint32 UVar1;
  VkDescriptorSetLayout SetLayout;
  byte bVar2;
  _Alloc_hider DebugName;
  IMemoryAllocator *MemAllocator;
  PipelineResourceDesc *pPVar3;
  PipelineResourceAttribsType *pPVar4;
  RenderDeviceVkImpl *pRVar5;
  char (*in_RCX) [31];
  uint uVar6;
  Uint32 ResIndex;
  ulong uVar7;
  string msg;
  DescriptorSetAllocation SetAllocation;
  string local_70;
  DescriptorSetAllocation local_50;
  
  uVar6 = (uint)((this->m_VkDescrSetLayouts)._M_elems[1].m_VkObject !=
                (VkDescriptorSetLayout_T *)0x0) +
          (uint)((this->m_VkDescrSetLayouts)._M_elems[0].m_VkObject !=
                (VkDescriptorSetLayout_T *)0x0);
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      if ((this->m_DescriptorSetSizes)._M_elems[uVar7] == 0xffffffff) {
        FormatString<char[26],char[31]>
                  (&local_70,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_DescriptorSetSizes[i] != ~0U",in_RCX);
        in_RCX = (char (*) [31])0x1f2;
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"InitSRBResourceCache",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                   ,0x1f2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  ResIndex = 0;
  MemAllocator = SRBMemoryAllocator::GetResourceCacheDataAllocator
                           (&(this->
                             super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                             m_SRBMemAllocator,0);
  ShaderResourceCacheVk::InitializeSets
            (ResourceCache,MemAllocator,uVar6,(this->m_DescriptorSetSizes)._M_elems);
  UVar1 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources;
  if (UVar1 != 0) {
    uVar6 = *(uint *)&ResourceCache->field_0x1c;
    do {
      pPVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                         (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                          ResIndex);
      pPVar4 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                         (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                          ResIndex);
      bVar2 = (byte)((ulong)*(undefined8 *)pPVar4 >> 0x38);
      ShaderResourceCacheVk::InitializeResources
                (ResourceCache,(uint)((ulong)*(undefined8 *)pPVar4 >> 0x3e) & 1,
                 (&pPVar4->SRBCacheOffset)[~uVar6 >> 0x1f],pPVar3->ArraySize,bVar2 >> 1 & Unknown,
                 (bool)(bVar2 >> 7));
      ResIndex = ResIndex + 1;
    } while (UVar1 != ResIndex);
  }
  ShaderResourceCacheVk::DbgVerifyResourceInitialization(ResourceCache);
  SetLayout = (this->m_VkDescrSetLayouts)._M_elems[0].m_VkObject;
  if (SetLayout != (VkDescriptorSetLayout)0x0) {
    std::__cxx11::string::string
              ((string *)&local_70,
               (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,(allocator *)&local_50);
    std::__cxx11::string::append((char *)&local_70);
    DebugName._M_p = local_70._M_dataplus._M_p;
    pRVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          *)this);
    DescriptorSetAllocator::Allocate
              (&local_50,&pRVar5->m_DescriptorSetAllocator,0xffffffffffffffff,SetLayout,
               DebugName._M_p);
    GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>(this);
    ShaderResourceCacheVk::AssignDescriptorSetAllocation(ResourceCache,0,&local_50);
    DescriptorSetAllocation::Release(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void PipelineResourceSignatureVkImpl::InitSRBResourceCache(ShaderResourceCacheVk& ResourceCache)
{
    const auto NumSets = GetNumDescriptorSets();
#ifdef DILIGENT_DEBUG
    for (Uint32 i = 0; i < NumSets; ++i)
        VERIFY_EXPR(m_DescriptorSetSizes[i] != ~0U);
#endif

    auto& CacheMemAllocator = m_SRBMemAllocator.GetResourceCacheDataAllocator(0);
    ResourceCache.InitializeSets(CacheMemAllocator, NumSets, m_DescriptorSetSizes.data());

    const auto TotalResources = GetTotalResourceCount();
    const auto CacheType      = ResourceCache.GetContentType();
    for (Uint32 r = 0; r < TotalResources; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& Attr    = GetResourceAttribs(r);
        ResourceCache.InitializeResources(Attr.DescrSet, Attr.CacheOffset(CacheType), ResDesc.ArraySize,
                                          Attr.GetDescriptorType(), Attr.IsImmutableSamplerAssigned());
    }

#ifdef DILIGENT_DEBUG
    ResourceCache.DbgVerifyResourceInitialization();
#endif

    if (auto vkLayout = GetVkDescriptorSetLayout(DESCRIPTOR_SET_ID_STATIC_MUTABLE))
    {
        const char* DescrSetName = "Static/Mutable Descriptor Set";
#ifdef DILIGENT_DEVELOPMENT
        std::string _DescrSetName{m_Desc.Name};
        _DescrSetName.append(" - static/mutable set");
        DescrSetName = _DescrSetName.c_str();
#endif
        DescriptorSetAllocation SetAllocation = GetDevice()->AllocateDescriptorSet(~Uint64{0}, vkLayout, DescrSetName);
        ResourceCache.AssignDescriptorSetAllocation(GetDescriptorSetIndex<DESCRIPTOR_SET_ID_STATIC_MUTABLE>(), std::move(SetAllocation));
    }
}